

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O3

int main(int argc,char **argv)

{
  ACUTEST_CMDLINE_OPTION_ *pAVar1;
  acutest_state_ aVar2;
  _func_void *__s;
  FILE *__s_00;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  acutest_state_ aVar7;
  __pid_t __pid;
  undefined4 uVar8;
  uint *puVar9;
  acutest_test_data_ *paVar10;
  char *pcVar11;
  ssize_t sVar12;
  char cVar13;
  char *pcVar14;
  ulong uVar15;
  byte bVar16;
  undefined4 uVar17;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  ACUTEST_CMDLINE_OPTION_ *pAVar18;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  long lVar19;
  long extraout_RDX_09;
  long extraout_RDX_10;
  long extraout_RDX_11;
  long extraout_RDX_12;
  uint uVar20;
  char *unaff_RBX;
  size_t __n;
  char *pcVar21;
  int iVar22;
  uint uVar23;
  ACUTEST_CMDLINE_OPTION_ *pAVar24;
  undefined8 in_R8;
  undefined4 uVar25;
  undefined8 in_R9;
  long lVar26;
  uint uVar27;
  ACUTEST_CMDLINE_OPTION_ *unaff_R15;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int exit_code;
  acutest_timer_type_ start;
  acutest_timer_type_ end;
  uint local_254;
  ACUTEST_CMDLINE_OPTION_ local_250;
  ACUTEST_CMDLINE_OPTION_ local_238;
  undefined1 local_218;
  undefined8 local_59;
  char *pcStack_51;
  
  acutest_argv0_ = *argv;
  acutest_colorize_ = isatty(1);
  acutest_list_size_ = 1;
  uVar23 = 0x10;
  acutest_test_data_ = (acutest_test_data_ *)calloc(2,0x10);
  if (acutest_test_data_ == (acutest_test_data_ *)0x0) {
    main_cold_1();
  }
  local_218 = 0;
  lVar19 = extraout_RDX;
  if (1 < argc) {
    iVar22 = 1;
    unaff_RBX = (char *)0x0;
LAB_001030db:
    pAVar18 = (ACUTEST_CMDLINE_OPTION_ *)argv[iVar22];
    if ((int)unaff_RBX != 0) {
LAB_001031b5:
      iVar5 = acutest_cmdline_callback_(0,(char *)pAVar18);
      lVar19 = extraout_RDX_00;
LAB_001031c1:
      uVar23 = (uint)pAVar18;
      if (iVar5 == 0) goto LAB_001031c9;
      goto LAB_001033ce;
    }
    if (pAVar18->shortname != '-') {
      unaff_RBX = (char *)0x0;
      goto LAB_001031b5;
    }
    cVar13 = pAVar18->field_0x1;
    if (cVar13 == '\0') goto LAB_001031b5;
    if ((cVar13 != '-') || (pAVar18->field_0x2 != '\0')) {
      pAVar24 = (ACUTEST_CMDLINE_OPTION_ *)&pAVar18->field_0x2;
      iVar5 = 0x58;
      unaff_R15 = acutest_cmdline_options_;
      local_250._16_8_ = (long)iVar22;
      do {
        __s = (_func_void *)unaff_R15->longname;
        if (__s == (_func_void *)0x0 || cVar13 != '-') {
          if (cVar13 == unaff_R15->shortname) {
            if ((unaff_R15->flags & 2) == 0) {
              pAVar18 = (ACUTEST_CMDLINE_OPTION_ *)0x0;
              iVar5 = acutest_cmdline_callback_(iVar5,(char *)0x0);
              uVar23 = (uint)pAVar18;
              lVar19 = extraout_RDX_01;
              if (iVar5 != 0) goto LAB_001033ce;
              pcVar14 = argv[local_250._16_8_];
              cVar13 = pcVar14[2];
              unaff_RBX = (char *)0x0;
              if (cVar13 == '\0') goto LAB_001031c9;
              unaff_R15 = (ACUTEST_CMDLINE_OPTION_ *)0x0;
              goto LAB_00103216;
            }
            if (*(char *)pAVar24 == '\0') {
              iVar4 = iVar22 + 1;
              if (iVar4 < argc) {
                pAVar18 = (ACUTEST_CMDLINE_OPTION_ *)argv[iVar4];
                iVar5 = acutest_cmdline_callback_(iVar5,(char *)pAVar18);
                unaff_RBX = (char *)0x0;
                lVar19 = extraout_RDX_04;
                iVar22 = iVar4;
                goto LAB_001031c1;
              }
              iVar5 = -0x7ffffffe;
              pAVar24 = pAVar18;
            }
LAB_00103367:
            iVar5 = acutest_cmdline_callback_(iVar5,&pAVar24->shortname);
            lVar19 = extraout_RDX_06;
            pAVar18 = pAVar24;
LAB_0010336e:
            unaff_RBX = (char *)0x0;
            goto LAB_001031c1;
          }
        }
        else {
          unaff_RBX = (char *)strlen((char *)__s);
          iVar4 = strncmp((char *)pAVar24,(char *)__s,(size_t)unaff_RBX);
          if (iVar4 == 0) {
            if (unaff_RBX[(long)pAVar24] == '=') {
              if ((unaff_R15->flags & 3) != 0) {
                pAVar24 = (ACUTEST_CMDLINE_OPTION_ *)(unaff_RBX + (long)&pAVar18->field_0x3);
                goto LAB_00103367;
              }
              unaff_R15 = &local_238;
              snprintf(&unaff_R15->shortname,0x21,"--%s",__s);
              pAVar18 = unaff_R15;
              iVar5 = acutest_cmdline_callback_(-0x7ffffffd,&unaff_R15->shortname);
              lVar19 = extraout_RDX_08;
              goto LAB_0010336e;
            }
            if (unaff_RBX[(long)pAVar24] == '\0') {
              if ((unaff_R15->flags & 2) == 0) {
                pAVar18 = (ACUTEST_CMDLINE_OPTION_ *)0x0;
                iVar5 = acutest_cmdline_callback_(iVar5,(char *)0x0);
                lVar19 = extraout_RDX_05;
              }
              else {
                iVar5 = acutest_cmdline_callback_(-0x7ffffffe,(char *)pAVar18);
                lVar19 = extraout_RDX_07;
              }
              unaff_RBX = (char *)0x0;
              goto LAB_001031c1;
            }
          }
        }
        iVar5 = unaff_R15[1].id;
        unaff_R15 = unaff_R15 + 1;
      } while (iVar5 != 0);
      unaff_R15 = pAVar18;
      if ((cVar13 == '-') && (pcVar14 = strchr((char *)pAVar18,0x3d), pcVar14 != (char *)0x0)) {
        __n = (long)pcVar14 - (long)pAVar18;
        if (0x1f < __n) {
          __n = 0x20;
        }
        strncpy(&local_238.shortname,(char *)pAVar18,__n);
        (&local_238.shortname)[__n] = '\0';
        unaff_R15 = &local_238;
      }
      pAVar18 = unaff_R15;
      iVar5 = acutest_cmdline_callback_(-0x7fffffff,&unaff_R15->shortname);
      unaff_RBX = (char *)0x0;
      lVar19 = extraout_RDX_03;
      goto LAB_001031c1;
    }
    unaff_RBX = (char *)0x1;
    goto LAB_001031c9;
  }
LAB_001033ce:
  bVar16 = acutest_exclude_mode_;
  paVar10 = acutest_test_data_;
  if (acutest_timer_ - 1U < 2) {
    acutest_timer_id_ = acutest_timer_;
  }
  auVar28._0_4_ = -(uint)(acutest_test_data_->state == ACUTEST_STATE_SELECTED);
  auVar28._4_4_ = -(uint)(acutest_test_data_->state == ACUTEST_STATE_SELECTED);
  auVar28._8_4_ = -(uint)(acutest_test_data_[1].state == ACUTEST_STATE_SELECTED);
  auVar28._12_4_ = -(uint)(acutest_test_data_[1].state == ACUTEST_STATE_SELECTED);
  uVar8 = SUB84(acutest_test_data_,0);
  iVar22 = movmskpd(uVar8,auVar28);
  if (iVar22 == 0) {
    acutest_test_data_->state = ACUTEST_STATE_NEEDTORUN;
    paVar10[1].state = ACUTEST_STATE_NEEDTORUN;
  }
  else {
    lVar19 = 0;
    do {
      uVar23 = ~(uint)(*(int *)((long)&paVar10->state + lVar19) == -3 ^ bVar16) | 0xfffffffe;
      *(uint *)((long)&paVar10->state + lVar19) = uVar23;
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0x20);
    lVar19 = 0;
  }
  iVar22 = acutest_no_exec_;
  if (acutest_no_exec_ < 0) {
    auVar29._0_4_ = -(uint)(paVar10->state == ACUTEST_STATE_NEEDTORUN);
    auVar29._4_4_ = -(uint)(paVar10->state == ACUTEST_STATE_NEEDTORUN);
    auVar29._8_4_ = -(uint)(paVar10[1].state == ACUTEST_STATE_NEEDTORUN);
    auVar29._12_4_ = -(uint)(paVar10[1].state == ACUTEST_STATE_NEEDTORUN);
    uVar6 = movmskpd(uVar8,auVar29);
    iVar22 = 1;
    if ((uVar6 - (uVar6 >> 1) & 2) != 0) {
      local_238.shortname = 10;
      uVar23 = 0;
      iVar5 = open("/proc/self/status",0);
      lVar19 = extraout_RDX_10;
      iVar22 = 0;
      if (iVar5 != -1) {
        unaff_RBX = (char *)((long)&local_59 + 1);
        unaff_R15 = &local_238;
        uVar3 = 1;
LAB_00103a3c:
        uVar15 = uVar3;
        if (uVar15 < 0x1ff) goto code_r0x00103a48;
        goto LAB_00103a68;
      }
    }
  }
  goto LAB_00103490;
  while( true ) {
    cVar13 = (pcVar14 + 3)[(long)unaff_R15];
    unaff_R15 = (ACUTEST_CMDLINE_OPTION_ *)&unaff_R15->field_0x1;
    if (cVar13 == '\0') break;
LAB_00103216:
    iVar5 = 0x58;
    pAVar18 = acutest_cmdline_options_;
    if (cVar13 != 'X') {
      pAVar24 = acutest_cmdline_options_;
      do {
        iVar5 = pAVar24[1].id;
        if (iVar5 == 0) {
          iVar4 = -0x7fffffff;
          goto LAB_00103255;
        }
        pAVar18 = pAVar24 + 1;
        pAVar1 = pAVar24 + 1;
        pAVar24 = pAVar18;
      } while (cVar13 != pAVar1->shortname);
    }
    iVar4 = -0x7ffffffe;
    if ((pAVar18->flags & 2) == 0) {
      pAVar18 = (ACUTEST_CMDLINE_OPTION_ *)0x0;
      iVar4 = iVar5;
    }
    else {
LAB_00103255:
      local_250.shortname = '-';
      local_250._2_1_ = 0;
      pAVar18 = &local_250;
      local_250._1_1_ = cVar13;
    }
    iVar5 = acutest_cmdline_callback_(iVar4,&pAVar18->shortname);
    uVar23 = (uint)pAVar18;
    lVar19 = extraout_RDX_02;
    if (iVar5 != 0) goto LAB_001033ce;
  }
LAB_001031c9:
  uVar23 = (uint)pAVar18;
  iVar22 = iVar22 + 1;
  if (argc <= iVar22) goto LAB_001033ce;
  goto LAB_001030db;
code_r0x00103a48:
  sVar12 = read(iVar5,&local_238.shortname + uVar15,0x1ff - uVar15);
  uVar3 = sVar12 + uVar15;
  if (0 < sVar12) goto LAB_00103a3c;
LAB_00103a68:
  (&local_238.shortname)[uVar15] = '\0';
  uVar23 = 0x1050fb;
  pcVar14 = strstr(&unaff_R15->shortname,"\nTracerPid:");
  iVar22 = 0;
  if (pcVar14 != (char *)0x0 && pcVar14 < unaff_RBX) {
    uVar6 = atoi(pcVar14 + 0xb);
    unaff_RBX = (char *)(ulong)uVar6;
    close(iVar5);
    lVar19 = extraout_RDX_12;
    if (uVar6 != 0) {
      iVar22 = 1;
    }
    goto LAB_00103490;
  }
  if (uVar15 == 0x1ff) {
    local_238._0_8_ = local_59;
    local_238.longname = pcStack_51;
    uVar3 = 0x20;
    goto LAB_00103a3c;
  }
  close(iVar5);
  lVar19 = extraout_RDX_11;
LAB_00103490:
  acutest_no_exec_ = iVar22;
  if (acutest_tap_ == '\x01') {
    if (2 < acutest_verbose_level_) {
      acutest_verbose_level_ = 2;
    }
    acutest_no_summary_ = 1;
    if (acutest_worker_ == '\0') {
      auVar30._0_4_ = -(uint)(acutest_test_data_->state == ACUTEST_STATE_NEEDTORUN);
      auVar30._4_4_ = -(uint)(acutest_test_data_->state == ACUTEST_STATE_NEEDTORUN);
      auVar30._8_4_ = -(uint)(acutest_test_data_[1].state == ACUTEST_STATE_NEEDTORUN);
      auVar30._12_4_ = -(uint)(acutest_test_data_[1].state == ACUTEST_STATE_NEEDTORUN);
      uVar23 = movmskpd(uVar23,auVar30);
      printf("1..%d\n",(ulong)(uVar23 - (uVar23 >> 1)));
      lVar19 = extraout_RDX_09;
    }
  }
  lVar26 = 0;
  paVar10 = acutest_test_data_;
  iVar22 = acutest_worker_index_;
  do {
    if (*(int *)((long)&paVar10->state + lVar26) == -2) {
      unaff_R15 = (ACUTEST_CMDLINE_OPTION_ *)((long)&acutest_list_[0].name + lVar26);
      acutest_test_already_logged_ = 0;
      acutest_current_test_ = (acutest_test_ *)unaff_R15;
      clock_gettime(acutest_timer_id_,(timespec *)&local_250);
      if (acutest_no_exec_ == 0) {
        fflush(_stdout);
        fflush(_stderr);
        __pid = fork();
        if (__pid == -1) {
          puVar9 = (uint *)__errno_location();
          pcVar14 = strerror(*puVar9);
          acutest_error_("Cannot fork. %s [%d]",pcVar14,(ulong)*puVar9);
        }
        else {
          if (__pid == 0) {
            acutest_worker_ = 1;
            aVar7 = acutest_do_run_((acutest_test_ *)unaff_R15,iVar22);
            acutest_exit_(aVar7);
          }
          waitpid(__pid,(int *)&local_254,0);
          uVar23 = local_254 & 0x7f;
          if (uVar23 == 0) {
            unaff_RBX = (char *)(ulong)(local_254 >> 8 & 0xff);
            goto LAB_00103646;
          }
          if ((int)(uVar23 * 0x1000000 + 0x1000000) < 0x2000000) {
            acutest_error_("Test ended in an unexpected way [%d].",(ulong)local_254);
          }
          else {
            if ((uVar23 < 0x10) && ((0x452fU >> ((uint)((ulong)uVar23 - 1) & 0x1f) & 1) != 0)) {
              pAVar18 = (ACUTEST_CMDLINE_OPTION_ *)
                        (&DAT_00105158 + *(int *)(&DAT_00105158 + ((ulong)uVar23 - 1) * 4));
            }
            else {
              snprintf(&local_238.shortname,0x20,"signal %d");
              pAVar18 = &local_238;
            }
            acutest_error_("Test interrupted by %s.",pAVar18);
          }
        }
        unaff_RBX = (char *)0x1;
      }
      else {
        aVar7 = acutest_do_run_((acutest_test_ *)unaff_R15,iVar22);
        unaff_RBX = (char *)(ulong)(uint)aVar7;
      }
LAB_00103646:
      iVar22 = iVar22 + 1;
      clock_gettime(acutest_timer_id_,(timespec *)&local_238);
      paVar10 = acutest_test_data_;
      acutest_current_test_ = (acutest_test_ *)0x0;
      *(int *)((long)&acutest_test_data_->state + lVar26) = (int)unaff_RBX;
      lVar19 = (long)local_238.longname - (long)local_250.longname;
      *(double *)((long)&paVar10->duration + lVar26) =
           (double)lVar19 / 1000000000.0 +
           (double)(local_238._0_8_ -
                   CONCAT53(local_250._3_5_,
                            CONCAT12(local_250._2_1_,CONCAT11(local_250._1_1_,local_250.shortname)))
                   );
    }
    uVar25 = (undefined4)in_R9;
    uVar8 = (undefined4)in_R8;
    lVar26 = lVar26 + 0x10;
  } while (lVar26 != 0x20);
  if (acutest_verbose_level_ >= 1 && (acutest_no_summary_ & 1) == 0) {
    aVar7 = paVar10[1].state;
    aVar2 = paVar10->state;
    auVar32._0_4_ = -(uint)(aVar2 == ACUTEST_STATE_EXCLUDED);
    auVar32._4_4_ = -(uint)(aVar2 == ACUTEST_STATE_EXCLUDED);
    auVar32._8_4_ = -(uint)(aVar7 == ACUTEST_STATE_EXCLUDED);
    auVar32._12_4_ = -(uint)(aVar7 == ACUTEST_STATE_EXCLUDED);
    auVar31._0_4_ = -(uint)(aVar2 == ACUTEST_STATE_FAILED);
    auVar31._4_4_ = -(uint)(aVar2 == ACUTEST_STATE_FAILED);
    auVar31._8_4_ = -(uint)(aVar7 == ACUTEST_STATE_FAILED);
    auVar31._12_4_ = -(uint)(aVar7 == ACUTEST_STATE_FAILED);
    uVar17 = movmskpd((int)CONCAT71((int7)((ulong)lVar19 >> 8),
                                    acutest_verbose_level_ < 1 | acutest_no_summary_),auVar32);
    uVar27 = movmskpd((int)unaff_R15,auVar31);
    uVar23 = uVar27 - (uVar27 >> 1);
    bVar16 = (byte)uVar17 ^ 3;
    uVar6 = (uint)bVar16 - (uint)(bVar16 >> 1);
    if (2 < acutest_verbose_level_) {
      auVar33._0_4_ = -(uint)(paVar10->state == ACUTEST_STATE_SUCCESS);
      auVar33._4_4_ = -(uint)(paVar10->state == ACUTEST_STATE_SUCCESS);
      auVar33._8_4_ = -(uint)(paVar10[1].state == ACUTEST_STATE_SUCCESS);
      auVar33._12_4_ = -(uint)(paVar10[1].state == ACUTEST_STATE_SUCCESS);
      uVar20 = movmskpd((int)unaff_RBX,auVar33);
      acutest_colored_printf_(10,"Summary:\n");
      printf("  Count of run unit tests:        %4d\n",(ulong)uVar6);
      printf("  Count of successful unit tests: %4d\n",(ulong)(uVar20 - (uVar20 >> 1)));
      printf("  Count of failed unit tests:     %4d\n",(ulong)uVar23);
    }
    if ((char)uVar27 == '\0') {
      acutest_colored_printf_(0xc,"SUCCESS:");
      uVar23 = puts(" No unit tests have failed.");
    }
    else {
      acutest_colored_printf_(0xb,"FAILED:");
      pcVar14 = "have";
      if (((byte)uVar23 & 3) == 1) {
        pcVar14 = "has";
      }
      uVar23 = printf(" %d of %d unit tests %s failed.\n",(ulong)uVar23,(ulong)uVar6,pcVar14);
    }
    paVar10 = (acutest_test_data_ *)(ulong)uVar23;
    if (2 < acutest_verbose_level_) {
      uVar23 = putchar(10);
      paVar10 = (acutest_test_data_ *)(ulong)uVar23;
    }
  }
  __s_00 = acutest_xml_output_;
  iVar22 = (int)paVar10;
  if (acutest_xml_output_ != (FILE *)0x0) {
    pcVar14 = *argv;
    pcVar11 = strrchr(pcVar14,0x2f);
    pcVar21 = pcVar11 + 1;
    if (pcVar11 == (char *)0x0) {
      pcVar21 = pcVar14;
    }
    fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,(FILE *)__s_00);
    aVar7 = acutest_test_data_[1].state;
    aVar2 = acutest_test_data_->state;
    auVar34._0_4_ = -(uint)(aVar2 == ACUTEST_STATE_FAILED);
    auVar34._4_4_ = -(uint)(aVar2 == ACUTEST_STATE_FAILED);
    auVar34._8_4_ = -(uint)(aVar7 == ACUTEST_STATE_FAILED);
    auVar34._12_4_ = -(uint)(aVar7 == ACUTEST_STATE_FAILED);
    uVar6 = movmskpd(uVar8,auVar34);
    auVar35._0_4_ = -(uint)(aVar2 == ACUTEST_STATE_SKIPPED);
    auVar35._4_4_ = -(uint)(aVar2 == ACUTEST_STATE_SKIPPED);
    auVar35._8_4_ = -(uint)(aVar7 == ACUTEST_STATE_SKIPPED);
    auVar35._12_4_ = -(uint)(aVar7 == ACUTEST_STATE_SKIPPED);
    uVar23 = movmskpd(uVar6 >> 1,auVar35);
    auVar36._0_4_ = -(uint)(aVar2 == ACUTEST_STATE_EXCLUDED);
    auVar36._4_4_ = -(uint)(aVar2 == ACUTEST_STATE_EXCLUDED);
    auVar36._8_4_ = -(uint)(aVar7 == ACUTEST_STATE_EXCLUDED);
    auVar36._12_4_ = -(uint)(aVar7 == ACUTEST_STATE_EXCLUDED);
    uVar27 = movmskpd(uVar25,auVar36);
    fprintf((FILE *)acutest_xml_output_,
            "<testsuite name=\"%s\" tests=\"%d\" errors=\"0\" failures=\"%d\" skip=\"%d\">\n",
            pcVar21,2,(ulong)(uVar6 - (uVar6 >> 1)),
            (ulong)((uVar27 - (uVar27 >> 1)) + (uVar23 - (uVar23 >> 1))));
    lVar19 = 0;
    do {
      paVar10 = acutest_test_data_;
      fprintf((FILE *)acutest_xml_output_,"  <testcase name=\"%s\" time=\"%.2f\">\n",
              *(undefined8 *)((long)&acutest_test_data_->duration + lVar19),
              *(undefined8 *)((long)&acutest_list_[0].name + lVar19));
      iVar22 = *(int *)((long)&paVar10->state + lVar19);
      pcVar14 = "<skipped />";
      if (iVar22 == -1) {
LAB_00103925:
        fprintf((FILE *)acutest_xml_output_,"    %s\n",pcVar14);
      }
      else if (iVar22 != 0) {
        pcVar14 = "<skipped />";
        if (iVar22 != 2) {
          pcVar14 = "<failure />";
        }
        goto LAB_00103925;
      }
      fwrite("  </testcase>\n",0xe,1,(FILE *)acutest_xml_output_);
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0x20);
    fwrite("</testsuite>\n",0xd,1,(FILE *)acutest_xml_output_);
    iVar22 = fclose((FILE *)acutest_xml_output_);
  }
  if ((acutest_worker_ == '\x01') &&
     (auVar37._0_4_ = -(uint)(acutest_test_data_->state == ACUTEST_STATE_EXCLUDED),
     auVar37._4_4_ = -(uint)(acutest_test_data_->state == ACUTEST_STATE_EXCLUDED),
     auVar37._8_4_ = -(uint)(acutest_test_data_[1].state == ACUTEST_STATE_EXCLUDED),
     auVar37._12_4_ = -(uint)(acutest_test_data_[1].state == ACUTEST_STATE_EXCLUDED),
     uVar8 = movmskpd(iVar22,auVar37), bVar16 = (byte)uVar8 + 3,
     (bVar16 & 3) < (((byte)uVar8 ^ bVar16) & 3))) {
    aVar7 = acutest_test_data_->state;
    if (acutest_test_data_->state == ACUTEST_STATE_EXCLUDED) {
      aVar7 = ACUTEST_STATE_FAILED;
      if (acutest_test_data_[1].state != ACUTEST_STATE_EXCLUDED) {
        aVar7 = acutest_test_data_[1].state;
      }
    }
  }
  else {
    aVar7 = (uint)(acutest_test_data_[1].state == ACUTEST_STATE_FAILED ||
                  acutest_test_data_->state == ACUTEST_STATE_FAILED);
  }
  free(acutest_test_data_);
  return aVar7;
}

Assistant:

int
main(int argc, char** argv)
{
    int i, index;
    int exit_code = 1;

    acutest_argv0_ = argv[0];

#if defined ACUTEST_UNIX_
    acutest_colorize_ = isatty(STDOUT_FILENO);
#elif defined ACUTEST_WIN_
 #if defined _BORLANDC_
    acutest_colorize_ = isatty(_fileno(stdout));
 #else
    acutest_colorize_ = _isatty(_fileno(stdout));
 #endif
#else
    acutest_colorize_ = 0;
#endif

    /* Count all test units */
    acutest_list_size_ = 0;
    for(i = 0; acutest_list_[i].func != NULL; i++)
        acutest_list_size_++;

    acutest_test_data_ = (struct acutest_test_data_*)calloc(acutest_list_size_, sizeof(struct acutest_test_data_));
    if(acutest_test_data_ == NULL) {
        fprintf(stderr, "Out of memory.\n");
        acutest_exit_(2);
    }

    /* Parse options */
    acutest_cmdline_read_(acutest_cmdline_options_, argc, argv, acutest_cmdline_callback_);

    /* Initialize the proper timer. */
    acutest_timer_init_();

#if defined(ACUTEST_WIN_)
    SetUnhandledExceptionFilter(acutest_seh_exception_filter_);
#ifdef _MSC_VER
    _set_abort_behavior(0, _WRITE_ABORT_MSG);
#endif
#endif

    /* Determine what to run. */
    if(acutest_count_(ACUTEST_STATE_SELECTED) > 0) {
        enum acutest_state_ if_selected;
        enum acutest_state_ if_unselected;

        if(!acutest_exclude_mode_) {
            if_selected = ACUTEST_STATE_NEEDTORUN;
            if_unselected = ACUTEST_STATE_EXCLUDED;
        } else {
            if_selected = ACUTEST_STATE_EXCLUDED;
            if_unselected = ACUTEST_STATE_NEEDTORUN;
        }

        for(i = 0; acutest_list_[i].func != NULL; i++) {
            if(acutest_test_data_[i].state == ACUTEST_STATE_SELECTED)
                acutest_test_data_[i].state = if_selected;
            else
                acutest_test_data_[i].state = if_unselected;
        }
    } else {
        /* By default, we want to run all tests. */
        for(i = 0; acutest_list_[i].func != NULL; i++)
            acutest_test_data_[i].state = ACUTEST_STATE_NEEDTORUN;
    }

    /* By default, we want to suppress running tests as child processes if we
     * run just one test, or if we're under debugger: Debugging tests is then
     * so much easier. */
    if(acutest_no_exec_ < 0) {
        if(acutest_count_(ACUTEST_STATE_NEEDTORUN) <= 1  ||  acutest_under_debugger_())
            acutest_no_exec_ = 1;
        else
            acutest_no_exec_ = 0;
    }

    if(acutest_tap_) {
        /* TAP requires we know test result ("ok", "not ok") before we output
         * anything about the test, and this gets problematic for larger verbose
         * levels. */
        if(acutest_verbose_level_ > 2)
            acutest_verbose_level_ = 2;

        /* TAP harness should provide some summary. */
        acutest_no_summary_ = 1;

        if(!acutest_worker_)
            printf("1..%d\n", acutest_count_(ACUTEST_STATE_NEEDTORUN));
    }

    index = acutest_worker_index_;
    for(i = 0; acutest_list_[i].func != NULL; i++) {
        if(acutest_test_data_[i].state == ACUTEST_STATE_NEEDTORUN)
            acutest_run_(&acutest_list_[i], index++, i);
    }

    /* Write a summary */
    if(!acutest_no_summary_ && acutest_verbose_level_ >= 1) {
        int n_run, n_success, n_failed ;

        n_run = acutest_list_size_ - acutest_count_(ACUTEST_STATE_EXCLUDED);
        n_success = acutest_count_(ACUTEST_STATE_SUCCESS);
        n_failed = acutest_count_(ACUTEST_STATE_FAILED);

        if(acutest_verbose_level_ >= 3) {
            acutest_colored_printf_(ACUTEST_COLOR_DEFAULT_INTENSIVE_, "Summary:\n");

            printf("  Count of run unit tests:        %4d\n", n_run);
            printf("  Count of successful unit tests: %4d\n", n_success);
            printf("  Count of failed unit tests:     %4d\n", n_failed);
        }

        if(n_failed == 0) {
            acutest_colored_printf_(ACUTEST_COLOR_GREEN_INTENSIVE_, "SUCCESS:");
            printf(" No unit tests have failed.\n");
        } else {
            acutest_colored_printf_(ACUTEST_COLOR_RED_INTENSIVE_, "FAILED:");
            printf(" %d of %d unit tests %s failed.\n",
                    n_failed, n_run, (n_failed == 1) ? "has" : "have");
        }

        if(acutest_verbose_level_ >= 3)
            printf("\n");
    }

    if (acutest_xml_output_) {
        const char* suite_name = acutest_basename_(argv[0]);
        fprintf(acutest_xml_output_, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
        fprintf(acutest_xml_output_, "<testsuite name=\"%s\" tests=\"%d\" errors=\"0\" failures=\"%d\" skip=\"%d\">\n",
            suite_name,
            (int)acutest_list_size_,
            acutest_count_(ACUTEST_STATE_FAILED),
            acutest_count_(ACUTEST_STATE_SKIPPED) + acutest_count_(ACUTEST_STATE_EXCLUDED));
        for(i = 0; acutest_list_[i].func != NULL; i++) {
            struct acutest_test_data_ *details = &acutest_test_data_[i];
            const char* str_state;
            fprintf(acutest_xml_output_, "  <testcase name=\"%s\" time=\"%.2f\">\n", acutest_list_[i].name, details->duration);

            switch(details->state) {
                case ACUTEST_STATE_SUCCESS:     str_state = NULL; break;
                case ACUTEST_STATE_EXCLUDED:    /* Fall through. */
                case ACUTEST_STATE_SKIPPED:     str_state = "<skipped />"; break;
                case ACUTEST_STATE_FAILED:      /* Fall through. */
                default:                        str_state = "<failure />"; break;
            }

            if(str_state != NULL)
                fprintf(acutest_xml_output_, "    %s\n", str_state);
            fprintf(acutest_xml_output_, "  </testcase>\n");
        }
        fprintf(acutest_xml_output_, "</testsuite>\n");
        fclose(acutest_xml_output_);
    }

    if(acutest_worker_  &&  acutest_count_(ACUTEST_STATE_EXCLUDED)+1 == acutest_list_size_) {
        /* If we are the child process, we need to propagate the test state
         * without any moderation. */
        for(i = 0; acutest_list_[i].func != NULL; i++) {
            if(acutest_test_data_[i].state != ACUTEST_STATE_EXCLUDED) {
                exit_code = (int) acutest_test_data_[i].state;
                break;
            }
        }
    } else {
        if(acutest_count_(ACUTEST_STATE_FAILED) > 0)
            exit_code = 1;
        else
            exit_code = 0;
    }

    acutest_cleanup_();
    return exit_code;
}